

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Binasc.cpp
# Opt level: O1

int __thiscall
smf::Binasc::processMidiPitchBendWord(Binasc *this,ostream *out,string *word,int lineNum)

{
  byte bVar1;
  pointer pcVar2;
  undefined8 in_RAX;
  ostream *poVar3;
  uint uVar4;
  double dVar5;
  double dVar6;
  undefined8 uStack_18;
  
  if (1 < word->_M_string_length) {
    pcVar2 = (word->_M_dataplus)._M_p;
    bVar1 = pcVar2[1];
    if (((int)(char)bVar1 - 0x30U < 10) ||
       ((bVar1 < 0x2f && ((0x680000000000U >> ((ulong)bVar1 & 0x3f) & 1) != 0)))) {
      uStack_18 = in_RAX;
      dVar5 = strtod(pcVar2 + 1,(char **)0x0);
      dVar6 = 1.0;
      if (dVar5 <= 1.0) {
        dVar6 = dVar5;
      }
      dVar5 = -1.0;
      if (-1.0 <= dVar6) {
        dVar5 = dVar6;
      }
      uVar4 = (uint)((dVar5 + 1.0) * 8191.5 + 0.5);
      uStack_18 = CONCAT17(uStack_18._7_1_,CONCAT16((char)uVar4,(undefined6)uStack_18)) &
                  0xff7fffffffffffff;
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,(char *)((long)&uStack_18 + 6),1);
      uStack_18 = CONCAT17((char)(uVar4 >> 7),(undefined7)uStack_18) & 0x7fffffffffffffff;
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)((long)&uStack_18 + 7),1);
      return 1;
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error on line: ",0xf);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,lineNum);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,": \'p\' needs to be followed immediately by ",0x2a);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"a floating-point number",0x17);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  return 0;
}

Assistant:

int Binasc::processMidiPitchBendWord(std::ostream& out, const std::string& word,
		int lineNum) {
	if (word.size() < 2) {
		std::cerr << "Error on line: " << lineNum
			  << ": 'p' needs to be followed immediately by "
			  << "a floating-point number" << std::endl;
		return 0;
	}
	if (!(isdigit(word[1]) || word[1] == '.' || word[1] == '-'
			|| word[1] == '+')) {
		std::cerr << "Error on line: " << lineNum
			  << ": 'p' needs to be followed immediately by "
			  << "a floating-point number" << std::endl;
		return 0;
	}
	double value = strtod(&word[1], NULL);

	if (value > 1.0) {
		value = 1.0;
	}
	if (value < -1.0) {
		value = -1.0;
	}

	int intval = (int)(((1 << 13)-0.5)  * (value + 1.0) + 0.5);
	uchar LSB = intval & 0x7f;
	uchar MSB = (intval >>  7) & 0x7f;
	out << LSB << MSB;
	return 1;
}